

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O1

void __thiscall
LidarSensor::PredictMeasurement
          (LidarSensor *this,MatrixXd *Xsig_pred,VectorXd *weights_m,VectorXd *weights_c,
          MatrixXd *Zsig,VectorXd *z_pred,MatrixXd *S,bool modified)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  Index size;
  double *pdVar6;
  ulong uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  Index othersize;
  Index size_1;
  Index size_2;
  MatrixXd local_d8;
  MatrixXd *local_c0;
  ulong local_b8;
  VectorXd *local_b0;
  MatrixXd *local_a8;
  MatrixXd *local_a0;
  undefined1 *local_98;
  void *local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  LidarSensor *local_78;
  ulong local_70;
  VectorXd *local_68;
  ulong local_60;
  double local_58;
  undefined8 uStack_50;
  MatrixXd *local_48;
  PlainObject *local_40;
  
  lVar14 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  local_b0 = weights_m;
  local_78 = this;
  if (lVar14 < 0) {
    pcVar11 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    uVar13 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
    local_c0 = Zsig;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar14,1);
    lVar15 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (lVar15 != lVar14) {
      pcVar11 = 
      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
      ;
LAB_001194ec:
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,pcVar11);
    }
    uVar9 = lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar15) {
      lVar14 = 0;
      do {
        pdVar2 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + lVar14;
        *pdVar2 = 0.0;
        pdVar2[1] = 0.0;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar9);
    }
    if ((long)uVar9 < lVar15) {
      memset((z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data + (lVar15 / 2) * 2,0,lVar15 * 8 + (lVar15 / 2) * -0x10);
    }
    local_a8 = (MatrixXd *)
               (S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
    local_a0 = (MatrixXd *)
               (S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols;
    local_98 = (undefined1 *)0x0;
    local_68 = weights_c;
    if (-1 < (long)((ulong)local_a0 | (ulong)local_a8)) {
      local_b8 = uVar13 & 0xffffffff;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)S,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_a8);
      local_70 = uVar13;
      if (0 < (int)uVar13) {
        local_60 = (ulong)((uint)local_b8 & 0x7fffffff);
        lVar14 = 0;
        uVar13 = 0;
        do {
          lVar15 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
          if ((lVar15 < 1) ||
             ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_cols <= (long)uVar13)) {
LAB_00119410:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x72,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1>, Level = 0]"
                         );
          }
          uVar9 = (local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_rows;
          if (((long)uVar9 < 1) ||
             ((local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_cols <= (long)uVar13)) {
LAB_001193f1:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x151,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                         );
          }
          pdVar2 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          pdVar6 = (local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          pdVar6[uVar9 * uVar13] = pdVar2[lVar15 * uVar13];
          if (lVar15 < 2) goto LAB_00119410;
          if ((long)uVar9 < 2) goto LAB_001193f1;
          pdVar6[uVar9 * uVar13 + 1] = pdVar2[lVar15 * uVar13 + 1];
          if ((local_b0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= (long)uVar13) goto LAB_0011942f;
          if ((local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_cols <= (long)uVar13) goto LAB_001193d2;
          if ((z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows != uVar9) {
            pcVar11 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
            ;
            goto LAB_0011957e;
          }
          local_58 = (local_b0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data[uVar13];
          uStack_50 = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar9,1
                    );
          uVar7 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                  .m_rows;
          if (uVar7 != uVar9) {
            pcVar11 = 
            "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
            ;
            goto LAB_001194ec;
          }
          uVar10 = uVar7 - ((long)uVar7 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar7) {
            lVar15 = 0;
            do {
              pdVar3 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              pdVar2 = pdVar3 + lVar15;
              dVar4 = pdVar2[1];
              pdVar1 = (double *)((long)pdVar6 + lVar15 * 8 + uVar9 * lVar14);
              dVar5 = pdVar1[1];
              pdVar3 = pdVar3 + lVar15;
              *pdVar3 = *pdVar1 * local_58 + *pdVar2;
              pdVar3[1] = dVar5 * local_58 + dVar4;
              lVar15 = lVar15 + 2;
            } while (lVar15 < (long)uVar10);
          }
          if ((long)uVar10 < (long)uVar7) {
            pdVar2 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            do {
              pdVar2[uVar10] =
                   *(double *)((long)pdVar6 + uVar10 * 8 + uVar9 * lVar14) * local_58 +
                   pdVar2[uVar10];
              uVar10 = uVar10 + 1;
            } while (uVar7 != uVar10);
          }
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 8;
        } while (uVar13 != local_60);
      }
      uVar13 = (ulong)modified;
      if ((int)(uint)modified < (int)local_70) {
        lVar14 = (ulong)modified << 3;
        do {
          local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
               = (double *)0x0;
          local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
               = 0;
          pdVar2 = (local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          if (modified) {
            uVar9 = (local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_rows;
            if (((long)uVar9 < 0) && (pdVar2 + uVar9 * uVar13 != (double *)0x0)) {
LAB_00119468:
              __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                            ,0x94,
                            "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                           );
            }
            lVar15 = (local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_cols;
            if (lVar15 <= (long)uVar13) goto LAB_001193d2;
            if (pdVar2 != (double *)0x0 && (long)uVar9 < 0) goto LAB_00119468;
            if (lVar15 < 1) goto LAB_001193d2;
            if ((long)uVar9 < 0) {
LAB_001194b8:
              __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                            ,0xf1,
                            "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                           );
            }
            pdVar6 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data;
            if (uVar9 != 0) {
              free((void *)0x0);
              if (uVar9 == 0) {
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_data = (double *)0x0;
                pdVar6 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_data;
              }
              else if ((0x1fffffffffffffff < uVar9) ||
                      (pdVar6 = (double *)malloc(uVar9 * 8), pdVar6 == (double *)0x0)) {
                puVar8 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar8 = operator_delete;
                __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
            }
            local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = pdVar6;
            uVar7 = uVar9 & 0x7ffffffffffffffe;
            if (1 < (long)uVar9) {
              uVar10 = 0;
              do {
                pdVar6 = (double *)((long)pdVar2 + uVar10 * 8 + uVar9 * lVar14);
                dVar4 = pdVar6[1];
                dVar5 = (pdVar2 + uVar10)[1];
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_data[uVar10] = *pdVar6 - pdVar2[uVar10];
                (local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_data + uVar10)[1] = dVar4 - dVar5;
                uVar10 = uVar10 + 2;
              } while (uVar10 < uVar7);
            }
            local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = uVar9;
            if ((long)uVar7 < (long)uVar9) {
              do {
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_data[uVar7] =
                     *(double *)((long)pdVar2 + uVar7 * 8 + uVar9 * lVar14) - pdVar2[uVar7];
                uVar7 = uVar7 + 1;
              } while (uVar9 != uVar7);
            }
          }
          else {
            uVar9 = (local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_rows;
            if (((long)uVar9 < 0) && (pdVar2 + uVar9 * uVar13 != (double *)0x0)) goto LAB_00119468;
            if ((local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_cols <= (long)uVar13) {
LAB_001193d2:
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                            ,0x76,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                           );
            }
            uVar7 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows;
            if (uVar9 != uVar7) {
              pcVar11 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
              goto LAB_0011957e;
            }
            if ((long)uVar7 < 0) goto LAB_001194b8;
            pdVar6 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data;
            if (uVar7 != 0) {
              free((void *)0x0);
              if (uVar7 == 0) {
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_data = (double *)0x0;
                pdVar6 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_data;
              }
              else if ((0x1fffffffffffffff < uVar7) ||
                      (pdVar6 = (double *)malloc(uVar7 * 8), pdVar6 == (double *)0x0)) {
                puVar8 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar8 = operator_delete;
                __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
            }
            local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = pdVar6;
            local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = uVar7;
            if (uVar7 != (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows) {
              pcVar11 = 
              "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>]"
              ;
              goto LAB_001194ec;
            }
            uVar10 = uVar7 & 0x7ffffffffffffffe;
            if (1 < (long)uVar7) {
              uVar12 = 0;
              do {
                pdVar6 = (double *)((long)pdVar2 + uVar12 * 8 + uVar9 * lVar14);
                dVar4 = pdVar6[1];
                pdVar1 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + uVar12;
                dVar5 = pdVar1[1];
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_data[uVar12] = *pdVar6 - *pdVar1;
                (local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_data + uVar12)[1] = dVar4 - dVar5;
                uVar12 = uVar12 + 2;
              } while (uVar12 < uVar10);
            }
            if ((long)uVar10 < (long)uVar7) {
              pdVar6 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              do {
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_data[uVar10] =
                     *(double *)((long)pdVar2 + uVar10 * 8 + uVar9 * lVar14) - pdVar6[uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar7 != uVar10);
            }
          }
          if ((local_68->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= (long)uVar13) {
LAB_0011942f:
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0xad,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          local_a0 = (MatrixXd *)
                     (local_68->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data[uVar13];
          local_90 = (void *)0x0;
          uStack_88 = 0;
          local_80 = 0;
          local_48 = S;
          local_a8 = &local_d8;
          local_98 = (undefined1 *)&local_d8;
          local_40 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_a8);
          if (((S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows != (local_a8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         ).m_storage.m_rows) ||
             ((S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
              != *(long *)(local_98 + 8))) {
            pcVar11 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
            ;
            goto LAB_0011957e;
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)S,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                      *)&local_48);
          free(local_90);
          free(local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 8;
        } while (uVar13 != local_b8);
      }
      local_a0 = &(local_78->super_Sensor).R_;
      local_a8 = S;
      if (((S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
           (local_78->super_Sensor).R_.
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) &&
         ((S->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
          (local_78->super_Sensor).R_.
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)S,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_a8);
        return;
      }
      pcVar11 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
      ;
LAB_0011957e:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseBinaryOp.h"
                    ,0x84,pcVar11);
    }
    pcVar11 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,pcVar11);
}

Assistant:

void LidarSensor::PredictMeasurement(const MatrixXd &Xsig_pred, const VectorXd &weights_m, const VectorXd &weights_c,
		                     MatrixXd &Zsig, VectorXd &z_pred, MatrixXd &S, bool modified) const {

    int n_z = z_pred.rows();
    int n_sigma = Zsig.cols();

    // Initialize output
    z_pred.fill(0.0);
    S.fill(0.0);

    // transform sigma points into measurement space
    for (int i=0; i<n_sigma; i++) {  // 2n+1 sigma points
	// prepare column i
	Zsig(0,i) = Xsig_pred(0,i);
	Zsig(1,i) = Xsig_pred(1,i);

        // add to mean predicted measurement
        z_pred = z_pred + weights_m(i) * Zsig.col(i);
    }

    // measurement covariance matrix S
    for (int i=(modified)?1:0; i<n_sigma; i++) {  // 2n+1 sigma points
        // residual
	VectorXd z_diff;
	if (modified)
            z_diff = Zsig.col(i) - Zsig.col(0);
	else
	    z_diff = Zsig.col(i) - z_pred;

        S = S + weights_c(i) * z_diff * z_diff.transpose();
    }

    S = S + GetR();
}